

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimCreator.hpp
# Opt level: O0

void __thiscall OpenMD::SimCreator::~SimCreator(SimCreator *this)

{
  void *in_RDI;
  
  ~SimCreator((SimCreator *)0x128948);
  operator_delete(in_RDI,0x28);
  return;
}

Assistant:

virtual ~SimCreator() = default;